

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceExamples.cpp
# Opt level: O2

void readGZ1(char *fileName,Array2D<Imath_3_2::half> *rPixels,Array2D<Imath_3_2::half> *gPixels,
            Array2D<float> *zPixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long sizeX;
  long lVar5;
  InputFile file;
  FrameBuffer frameBuffer;
  Slice local_68 [56];
  
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile(&file,fileName,iVar2);
  Imf_3_2::InputFile::header();
  piVar3 = (int *)Imf_3_2::Header::dataWindow();
  lVar5 = (long)*piVar3;
  iVar2 = piVar3[1];
  lVar4 = (long)iVar2;
  iVar1 = piVar3[3];
  *width = (piVar3[2] - *piVar3) + 1;
  sizeX = (iVar1 - lVar4) + 1;
  *height = (int)sizeX;
  Imf_3_2::Array2D<Imath_3_2::half>::resizeErase(rPixels,sizeX,(long)*width);
  Imf_3_2::Array2D<Imath_3_2::half>::resizeErase(gPixels,(long)*height,(long)*width);
  Imf_3_2::Array2D<float>::resizeErase(zPixels,(long)*height,(long)*width);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice
            (local_68,HALF,(char *)(rPixels->_data + (-lVar5 - *width * lVar4)),2,(long)*width * 2,1
             ,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"R");
  Imf_3_2::Slice::Slice
            (local_68,HALF,(char *)(gPixels->_data + (-lVar5 - *width * lVar4)),2,(long)*width * 2,1
             ,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"G");
  Imf_3_2::Slice::Slice
            (local_68,FLOAT,(char *)(zPixels->_data + (-lVar5 - *width * lVar4)),4,(long)*width << 2
             ,1,1,3.4028234663852886e+38,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"Z");
  Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&file);
  Imf_3_2::InputFile::readPixels((int)&file,iVar2);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&frameBuffer);
  Imf_3_2::InputFile::~InputFile(&file);
  return;
}

Assistant:

void
readGZ1 (
    const char      fileName[],
    Array2D<half>&  rPixels,
    Array2D<half>&  gPixels,
    Array2D<float>& zPixels,
    int&            width,
    int&            height)
{
    //
    // Read an image using class InputFile.  Try to read two
    // channels, R and G, of type HALF, and one channel, Z,
    // of type FLOAT.  Store the R, G, and Z pixels in three
    // separate memory buffers.
    // If a channel is missing in the file, the buffer for that
    // channel will be filled with an appropriate default value.
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- describe the layout of the R, G, and Z pixel buffers
    //	- read the pixels from the file
    //

    InputFile file (fileName);

    Box2i dw = file.header ().dataWindow ();
    width    = dw.max.x - dw.min.x + 1;
    height   = dw.max.y - dw.min.y + 1;

    rPixels.resizeErase (height, width);
    gPixels.resizeErase (height, width);
    zPixels.resizeErase (height, width);

    FrameBuffer frameBuffer;

    frameBuffer.insert ("R",					// name
			Slice (IMF::HALF,			// type
			       (char *) (&rPixels[0][0] -	// base
					 dw.min.x -
					 dw.min.y * width),
			       sizeof (rPixels[0][0]) * 1,	// xStride
			       sizeof (rPixels[0][0]) * width,	// yStride
			       1, 1,				// x/y sampling
			       0.0));				// fillValue

    frameBuffer.insert ("G",					// name
			Slice (IMF::HALF,			// type
			       (char *) (&gPixels[0][0] -	// base
					 dw.min.x -
					 dw.min.y * width),
			       sizeof (gPixels[0][0]) * 1,	// xStride
			       sizeof (gPixels[0][0]) * width,	// yStride
			       1, 1,				// x/y sampling
			       0.0));				// fillValue

    frameBuffer.insert ("Z",					// name
			Slice (IMF::FLOAT,			// type
			       (char *) (&zPixels[0][0] -	// base
					 dw.min.x -
					 dw.min.y * width),
			       sizeof (zPixels[0][0]) * 1,	 // xStride
			       sizeof (zPixels[0][0]) * width,	// yStride
			       1, 1,				// x/y sampling
			       std::numeric_limits<float>::max()));		// fillValue

    file.setFrameBuffer (frameBuffer);
    file.readPixels (dw.min.y, dw.max.y);
}